

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

void __thiscall result_tests::check_returned::test_method(check_returned *this)

{
  long in_FS_OFFSET;
  bilingual_str *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffae8;
  undefined1 success;
  string *in_stack_fffffffffffffaf0;
  string *original;
  allocator<char> *in_stack_fffffffffffffaf8;
  allocator<char> *__a;
  allocator<char> *__s;
  bilingual_str *s;
  allocator<char> local_4c9;
  allocator<char> local_4c8;
  allocator<char> local_4c7;
  allocator<char> local_4c6;
  allocator<char> local_4c5;
  undefined4 local_4c4;
  allocator<char> local_4bd;
  undefined4 local_4bc;
  int *in_stack_fffffffffffffb78;
  bilingual_str *in_stack_fffffffffffffb80;
  bilingual_str *in_stack_fffffffffffffb88;
  Result<bilingual_str> *in_stack_fffffffffffffb90;
  allocator<char> local_1c0 [64];
  string local_180 [9];
  bilingual_str local_50;
  long local_8;
  
  success = (undefined1)((ulong)in_stack_fffffffffffffae8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = &local_50;
  IntFn((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),(bool)success);
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  local_4bc = 5;
  ExpectSuccess<int,int>
            ((Result<int> *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  util::Result<int>::~Result((Result<int> *)in_stack_fffffffffffffab8);
  IntFn((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),(bool)success);
  __s = &local_4bd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&s->original,(char *)__s,in_stack_fffffffffffffaf8);
  Untranslated(in_stack_fffffffffffffaf0);
  ExpectFail<int>((Result<int> *)in_stack_fffffffffffffab8,(bilingual_str *)0x971b77);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffab8->original);
  std::allocator<char>::~allocator(&local_4bd);
  util::Result<int>::~Result((Result<int> *)in_stack_fffffffffffffab8);
  original = local_180;
  NoCopyFn((int)((ulong)s >> 0x20),SUB81((ulong)original >> 0x38,0));
  __a = local_1c0;
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  local_4c4 = 5;
  ExpectSuccess<result_tests::NoCopy,int>
            ((Result<result_tests::NoCopy> *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  util::Result<result_tests::NoCopy>::~Result
            ((Result<result_tests::NoCopy> *)in_stack_fffffffffffffab8);
  NoCopyFn((int)((ulong)s >> 0x20),SUB81((ulong)original >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&s->original,(char *)__s,__a);
  Untranslated(original);
  ExpectFail<result_tests::NoCopy>
            ((Result<result_tests::NoCopy> *)in_stack_fffffffffffffab8,(bilingual_str *)0x971c93);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffab8->original);
  std::allocator<char>::~allocator(&local_4c5);
  util::Result<result_tests::NoCopy>::~Result
            ((Result<result_tests::NoCopy> *)in_stack_fffffffffffffab8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&s->original,(char *)__s,__a);
  Untranslated(original);
  StrFn(s,SUB81((ulong)__s >> 0x38,0));
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&s->original,(char *)__s,__a);
  Untranslated(original);
  ExpectSuccess<bilingual_str,bilingual_str>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffab8->original);
  std::allocator<char>::~allocator(&local_4c7);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  util::Result<bilingual_str>::~Result((Result<bilingual_str> *)in_stack_fffffffffffffab8);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffab8->original);
  std::allocator<char>::~allocator(&local_4c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&s->original,(char *)__s,__a);
  Untranslated(original);
  StrFn(s,SUB81((ulong)__s >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&s->original,(char *)__s,__a);
  Untranslated(original);
  ExpectFail<bilingual_str>
            ((Result<bilingual_str> *)in_stack_fffffffffffffab8,(bilingual_str *)0x971ec1);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffab8->original);
  std::allocator<char>::~allocator(&local_4c9);
  util::Result<bilingual_str>::~Result((Result<bilingual_str> *)in_stack_fffffffffffffab8);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffab8->original);
  std::allocator<char>::~allocator(&local_4c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_returned)
{
    ExpectSuccess(IntFn(5, true), {}, 5);
    ExpectFail(IntFn(5, false), Untranslated("int 5 error."));
    ExpectSuccess(NoCopyFn(5, true), {}, 5);
    ExpectFail(NoCopyFn(5, false), Untranslated("nocopy 5 error."));
    ExpectSuccess(StrFn(Untranslated("S"), true), {}, Untranslated("S"));
    ExpectFail(StrFn(Untranslated("S"), false), Untranslated("str S error."));
}